

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

int Gloves_on(void)

{
  boolean bVar1;
  uint uVar2;
  
  if (uarmg == (obj *)0x0) {
    return 0;
  }
  uVar2 = u.uprops[objects[uarmg->otyp].oc_oprop].extrinsic;
  Oprops_on(uarmg,0x10);
  switch(uarmg->otyp) {
  case 0x8f:
    goto switchD_001824fd_caseD_8f;
  case 0x90:
    if (((uVar2 & 0xffffffef) == 0) && (u.uprops[0x25].intrinsic < 0x1000000)) {
      uVar2 = rnd(0x14);
      incr_itimeout(&u.uprops[0x25].intrinsic,(ulong)uVar2);
    }
    break;
  case 0x91:
    discover_object(0x91,'\x01','\x01');
    iflags.botl = '\x01';
    break;
  case 0x92:
    adj_abon(uarmg,uarmg->spe);
    break;
  default:
    warning("Unknown type of %s (%d)","gloves",(ulong)(uint)(int)uarmg->otyp);
  }
  if (uarmg != (obj *)0x0) {
switchD_001824fd_caseD_8f:
    bVar1 = is_racial_armor(uarmg,&youmonst);
    if (bVar1 == '\0') {
      u.uconduct.unracearmor = u.uconduct.unracearmor + 1;
    }
  }
  if (1 < moves) {
    discover_cursed_equip(uarmg);
  }
  return 0;
}

Assistant:

static int Gloves_on(void)
{
    long oldprop;

    if (!uarmg) return 0;

    oldprop = u.uprops[objects[uarmg->otyp].oc_oprop].extrinsic & ~WORN_GLOVES;

    Oprops_on(uarmg, WORN_GLOVES);

    switch(uarmg->otyp) {
	case LEATHER_GLOVES:
		break;
	case GAUNTLETS_OF_FUMBLING:
		if (!oldprop && !(HFumbling & ~TIMEOUT))
			incr_itimeout(&HFumbling, rnd(20));
		break;
	case GAUNTLETS_OF_POWER:
		makeknown(uarmg->otyp);
		iflags.botl = 1; /* taken care of in attrib.c */
		break;
	case GAUNTLETS_OF_DEXTERITY:
		adj_abon(uarmg, uarmg->spe);
		break;
	default: warning(unknown_type, c_gloves, uarmg->otyp);
    }

    if (uarmg && !is_racial_armor(uarmg, &youmonst))
	u.uconduct.unracearmor++;

    /* suppress message if called on first game turn via set_wear() */
    if (moves > 1)
	discover_cursed_equip(uarmg);

    return 0;
}